

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseDefaultDecl(xmlParserCtxtPtr ctxt,xmlChar **value)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *ret;
  int val;
  xmlChar **value_local;
  xmlParserCtxtPtr ctxt_local;
  
  *value = (xmlChar *)0x0;
  if (((((*ctxt->input->cur == '#') && (ctxt->input->cur[1] == 'R')) && (ctxt->input->cur[2] == 'E')
       ) && (((ctxt->input->cur[3] == 'Q' && (ctxt->input->cur[4] == 'U')) &&
             ((ctxt->input->cur[5] == 'I' &&
              ((ctxt->input->cur[6] == 'R' && (ctxt->input->cur[7] == 'E')))))))) &&
     (ctxt->input->cur[8] == 'D')) {
    ctxt->input->cur = ctxt->input->cur + 9;
    ctxt->input->col = ctxt->input->col + 9;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    ctxt_local._4_4_ = 2;
  }
  else if (((((*ctxt->input->cur == '#') && (ctxt->input->cur[1] == 'I')) &&
            (ctxt->input->cur[2] == 'M')) &&
           ((ctxt->input->cur[3] == 'P' && (ctxt->input->cur[4] == 'L')))) &&
          ((ctxt->input->cur[5] == 'I' &&
           ((ctxt->input->cur[6] == 'E' && (ctxt->input->cur[7] == 'D')))))) {
    ctxt->input->cur = ctxt->input->cur + 8;
    ctxt->input->col = ctxt->input->col + 8;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    ctxt_local._4_4_ = 3;
  }
  else {
    ret._4_4_ = 1;
    if (((*ctxt->input->cur == '#') &&
        (((ctxt->input->cur[1] == 'F' && (ctxt->input->cur[2] == 'I')) &&
         (ctxt->input->cur[3] == 'X')))) &&
       ((ctxt->input->cur[4] == 'E' && (ctxt->input->cur[5] == 'D')))) {
      ctxt->input->cur = ctxt->input->cur + 6;
      ctxt->input->col = ctxt->input->col + 6;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
      ret._4_4_ = 4;
      iVar1 = xmlSkipBlankCharsPE(ctxt);
      if (iVar1 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'#FIXED\'\n");
      }
    }
    pxVar2 = xmlParseAttValue(ctxt);
    if (pxVar2 == (xmlChar *)0x0) {
      xmlFatalErrMsg(ctxt,ctxt->errNo,"Attribute default value declaration error\n");
    }
    else {
      *value = pxVar2;
    }
    ctxt_local._4_4_ = ret._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseDefaultDecl(xmlParserCtxtPtr ctxt, xmlChar **value) {
    int val;
    xmlChar *ret;

    *value = NULL;
    if (CMP9(CUR_PTR, '#', 'R', 'E', 'Q', 'U', 'I', 'R', 'E', 'D')) {
	SKIP(9);
	return(XML_ATTRIBUTE_REQUIRED);
    }
    if (CMP8(CUR_PTR, '#', 'I', 'M', 'P', 'L', 'I', 'E', 'D')) {
	SKIP(8);
	return(XML_ATTRIBUTE_IMPLIED);
    }
    val = XML_ATTRIBUTE_NONE;
    if (CMP6(CUR_PTR, '#', 'F', 'I', 'X', 'E', 'D')) {
	SKIP(6);
	val = XML_ATTRIBUTE_FIXED;
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '#FIXED'\n");
	}
    }
    ret = xmlParseAttValue(ctxt);
    if (ret == NULL) {
	xmlFatalErrMsg(ctxt, (xmlParserErrors)ctxt->errNo,
		       "Attribute default value declaration error\n");
    } else
        *value = ret;
    return(val);
}